

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib_Memory.c
# Opt level: O3

void WjTestLib_Memory_GetStats
               (uint64_t *pTotalAllocs,uint64_t *pTotalFrees,uint64_t *pTotalOutstanding)

{
  if (pTotalAllocs != (uint64_t *)0x0) {
    *pTotalAllocs = gTotalNumAllocations;
  }
  if (pTotalFrees != (uint64_t *)0x0) {
    *pTotalFrees = gTotalNumFrees;
  }
  if (pTotalOutstanding != (uint64_t *)0x0) {
    *pTotalOutstanding = gTotalNumAllocations - gTotalNumFrees;
  }
  return;
}

Assistant:

void
    WjTestLib_Memory_GetStats
    (
        uint64_t*           pTotalAllocs,           // OPTIONAL
        uint64_t*           pTotalFrees,            // OPTIONAL
        uint64_t*           pTotalOutstanding       // OPTIONAL
    )
{
    if( NULL != pTotalAllocs)
    {
        *pTotalAllocs = gTotalNumAllocations;
    }
    if( NULL != pTotalFrees)
    {
        *pTotalFrees = gTotalNumFrees;
    }
    if( NULL != pTotalOutstanding)
    {
        *pTotalOutstanding = gTotalNumAllocations - gTotalNumFrees;
    }
}